

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O2

void Gia_ManPrintSignals(Gia_Man_t *p,int *pFreq,char *pStr)

{
  int iVar1;
  Vec_Int_t *p_00;
  ulong uVar2;
  Gia_Obj_t *pObj;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  p_00 = Vec_IntAlloc(100);
  uVar7 = (ulong)(uint)p->nObjs;
  if (p->nObjs < 1) {
    uVar7 = 0;
  }
  uVar4 = 0;
  uVar3 = 0;
  for (uVar2 = 0; uVar7 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = pFreq[uVar2];
    iVar6 = iVar1;
    if (iVar1 < 2) {
      iVar6 = 0;
    }
    uVar4 = (ulong)((int)uVar4 + (uint)(1 < iVar1));
    uVar3 = (ulong)(uint)((int)uVar3 + iVar6);
  }
  printf("%s (total = %d  driven = %d)\n",pStr,uVar4,uVar3);
  uVar5 = 0;
  for (uVar7 = 0; (long)uVar7 < (long)p->nObjs; uVar7 = uVar7 + 1) {
    if (10 < pFreq[uVar7]) {
      uVar5 = uVar5 + 1;
      pObj = Gia_ManObj(p,(int)uVar7);
      iVar1 = Gia_ObjId(p,pObj);
      printf("%3d :   Obj = %6d   Refs = %6d   Freq = %6d\n",(ulong)uVar5,uVar7 & 0xffffffff,
             (ulong)(uint)p->pRefs[iVar1],(ulong)(uint)pFreq[uVar7]);
      Vec_IntPush(p_00,(int)uVar7);
    }
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManPrintSignals( Gia_Man_t * p, int * pFreq, char * pStr )
{
    Vec_Int_t * vObjs;
    int i, Counter = 0, nTotal = 0;
    vObjs = Vec_IntAlloc( 100 );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pFreq[i] > 1 )
        {
            nTotal += pFreq[i];
            Counter++;
        }
    printf( "%s (total = %d  driven = %d)\n", pStr, Counter, nTotal );
    Counter = 0;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pFreq[i] > 10 )
        {
            printf( "%3d :   Obj = %6d   Refs = %6d   Freq = %6d\n", 
                ++Counter, i, Gia_ObjRefNum(p, Gia_ManObj(p,i)), pFreq[i] );
            Vec_IntPush( vObjs, i );
        }
    Vec_IntFree( vObjs );
}